

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariableTests.cpp
# Opt level: O3

void __thiscall
triggervariable_waitActivation_Test::TestBody(triggervariable_waitActivation_Test *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Result_base *this_00;
  int *piVar3;
  char *in_R9;
  _State_baseV2 *__tmp;
  atomic<bool> completed;
  atomic<bool> started;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  future<void> fut;
  byte local_152;
  byte local_151;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_150;
  AssertHelper local_148;
  _func_int **local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138 [2];
  undefined1 local_128 [40];
  __basic_future<void> local_100;
  TriggerVariable local_f0;
  
  local_f0.triggered._M_base._M_i = (__atomic_base<bool>)false;
  local_f0.activeLock.super___mutex_base._M_mutex.__align = 0;
  local_f0.activeLock.super___mutex_base._M_mutex._8_8_ = 0;
  local_f0.activeLock.super___mutex_base._M_mutex._16_8_ = 0;
  local_f0.activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  local_f0.activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  local_f0.triggerLock.super___mutex_base._M_mutex.__align = 0;
  local_f0.triggerLock.super___mutex_base._M_mutex._8_8_ = 0;
  local_f0.triggerLock.super___mutex_base._M_mutex._16_8_ = 0;
  local_f0.triggerLock.super___mutex_base._M_mutex.__size[0x18] = '\0';
  local_f0.triggerLock.super___mutex_base._M_mutex._25_7_ = 0;
  local_f0.triggerLock.super___mutex_base._M_mutex.__size[0x20] = '\0';
  local_f0._41_8_ = 0;
  std::condition_variable::condition_variable(&local_f0.cv_trigger);
  std::condition_variable::condition_variable(&local_f0.cv_active);
  local_151 = 0;
  local_152 = 0;
  local_128._0_8_ = (element_type *)0x0;
  local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  p_Var2->_M_use_count = 1;
  p_Var2->_M_weak_count = 1;
  p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00169c30;
  p_Var2[1]._M_use_count = 0;
  p_Var2[1]._M_weak_count = 0;
  *(undefined4 *)&p_Var2[2]._vptr__Sp_counted_base = 0;
  *(undefined1 *)((long)&p_Var2[2]._vptr__Sp_counted_base + 4) = 0;
  p_Var2[2]._M_use_count = 0;
  p_Var2[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var2[3]._M_use_count = 0;
  p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00169c80;
  this_00 = (_Result_base *)operator_new(0x10);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  std::__future_base::_Result_base::_Result_base(this_00);
  *(undefined ***)this_00 = &PTR__M_destroy_00169fc0;
  p_Var2[4]._vptr__Sp_counted_base = (_func_int **)this_00;
  *(byte **)&p_Var2[4]._M_use_count = &local_151;
  p_Var2[5]._vptr__Sp_counted_base = (_func_int **)&local_f0;
  *(byte **)&p_Var2[5]._M_use_count = &local_152;
  local_140 = (_func_int **)0x0;
  local_150._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20)
  ;
  *(undefined ***)local_150._M_head_impl = &PTR___State_00169cd8;
  *(element_type **)(local_150._M_head_impl + 8) = (element_type *)(p_Var2 + 1);
  *(code **)(local_150._M_head_impl + 0x10) =
       std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TriggerVariableTests.cpp:49:47)>_>,_void>
       ::_M_run;
  *(long *)(local_150._M_head_impl + 0x18) = 0;
  std::thread::_M_start_thread(&local_140,&local_150,0);
  if (local_150._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_150._M_head_impl + 8))();
  }
  if (p_Var2[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
    std::terminate();
  }
  p_Var2[3]._vptr__Sp_counted_base = local_140;
  local_128._0_8_ = (element_type *)(p_Var2 + 1);
  local_128._8_8_ = p_Var2;
  std::__basic_future<void>::__basic_future(&local_100,(__state_type *)local_128);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
  }
  do {
    sched_yield();
  } while ((local_151 & 1) == 0);
  local_140 = (_func_int **)(CONCAT71(local_140._1_7_,local_151) & 0xffffffffffffff01);
  local_138[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_151 & 1) == 0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_140,(AssertionResult *)"started.load()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TriggerVariableTests.cpp"
               ,0x3b,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((element_type *)local_128._0_8_ != (element_type *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
    if (local_138[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_138,local_138[0]);
    }
  }
  local_140 = (_func_int **)(CONCAT71(local_140._1_7_,~local_152) & 0xffffffffffffff01);
  local_138[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_152 & 1) != 0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_140,(AssertionResult *)"completed.load()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TriggerVariableTests.cpp"
               ,0x3c,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((element_type *)local_128._0_8_ != (element_type *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
    if (local_138[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_138,local_138[0]);
    }
  }
  gmlc::concurrency::TriggerVariable::activate(&local_f0);
  sched_yield();
  if ((local_152 & 1) == 0) {
    local_128._0_8_ = (element_type *)0x0;
    local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x5f5e100;
    do {
      iVar1 = nanosleep((timespec *)local_128,(timespec *)local_128);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  local_140 = (_func_int **)(CONCAT71(local_140._1_7_,local_152) & 0xffffffffffffff01);
  local_138[0] = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((local_152 & 1) == 0) {
    testing::Message::Message((Message *)&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_140,(AssertionResult *)"completed.load()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/TriggerVariableTests.cpp"
               ,0x42,(char *)local_128._0_8_);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((element_type *)local_128._0_8_ != (element_type *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if (local_150._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_150._M_head_impl + 8))();
    }
    if (local_138[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_138,local_138[0]);
    }
  }
  if (local_100._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::condition_variable::~condition_variable(&local_f0.cv_active);
  std::condition_variable::~condition_variable(&local_f0.cv_trigger);
  return;
}

Assistant:

TEST(triggervariable, waitActivation)
{
    TriggerVariable trigger;
    std::atomic<bool> started{false};
    std::atomic<bool> completed{false};
    auto fut = std::async(std::launch::async, [&]() {
        started = true;
        trigger.waitActivation();
        completed = true;
    });

    std::this_thread::yield();
    while (!started.load()) {
        std::this_thread::yield();
    }
    EXPECT_TRUE(started.load());
    EXPECT_FALSE(completed.load());
    trigger.activate();
    std::this_thread::yield();
    if (!completed.load()) {
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
    }
    EXPECT_TRUE(completed.load());
}